

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-cursor.c
# Opt level: O3

int coda_mem_cursor_get_array_dim(coda_cursor_conflict *cursor,int *num_dims,long *dim)

{
  coda_dynamic_type_struct *pcVar1;
  coda_type *pcVar2;
  int iVar3;
  long lVar4;
  
  pcVar1 = cursor->stack[(long)cursor->n + -1].type;
  if (pcVar1[1].backend == coda_backend_binary) {
    pcVar2 = pcVar1->definition;
    lVar4._0_4_ = pcVar2[1].type_class;
    lVar4._4_4_ = pcVar2[1].read_type;
    if (lVar4 < 0) {
      *num_dims = 1;
      *dim = *(long *)(pcVar1 + 2);
    }
    else {
      iVar3 = *(int *)&pcVar2[1].name;
      *num_dims = iVar3;
      if (0 < (long)iVar3) {
        lVar4 = 0;
        do {
          dim[lVar4] = (long)(&pcVar2[1].description)[lVar4];
          lVar4 = lVar4 + 1;
        } while (iVar3 != lVar4);
      }
    }
    return 0;
  }
  if (pcVar1[1].backend != 2) {
    __assert_fail("type->tag == tag_mem_array",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-cursor.c"
                  ,0x19d,"int coda_mem_cursor_get_array_dim(const coda_cursor *, int *, long *)");
  }
  iVar3 = coda_ascbin_cursor_get_array_dim(cursor,num_dims,dim);
  return iVar3;
}

Assistant:

int coda_mem_cursor_get_array_dim(const coda_cursor *cursor, int *num_dims, long dim[])
{
    coda_mem_type *type = (coda_mem_type *)cursor->stack[cursor->n - 1].type;
    coda_mem_array *array;

    if (type->tag == tag_mem_data)
    {
        return coda_ascbin_cursor_get_array_dim(cursor, num_dims, dim);
    }

    assert(type->tag == tag_mem_array);
    array = (coda_mem_array *)cursor->stack[cursor->n - 1].type;
    if (array->definition->num_elements >= 0)
    {
        int i;

        *num_dims = array->definition->num_dims;
        for (i = 0; i < array->definition->num_dims; i++)
        {
            dim[i] = array->definition->dim[i];
        }
    }
    else
    {
        *num_dims = 1;
        dim[0] = array->num_elements;
    }

    return 0;
}